

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzGetNextFolderItem(CSzFolder *f,CSzData *sd)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  Byte *pBVar4;
  SRes SVar5;
  uint uVar6;
  uint uVar7;
  SRes SVar8;
  ulong uVar10;
  UInt32 UVar11;
  CSzCoderInfo *pCVar12;
  Byte *pBVar13;
  long lVar14;
  UInt32 UVar15;
  size_t sVar16;
  ulong uVar17;
  UInt32 UVar18;
  UInt32 *value;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  UInt32 numStreams;
  Byte coderUsed [4];
  UInt32 numCoders;
  UInt32 local_68 [2];
  ulong local_60;
  CSzFolder *local_58;
  Byte *local_50;
  uint local_44;
  CSzCoderInfo *local_40;
  UInt32 local_38;
  uint local_34;
  ulong uVar9;
  
  pBVar13 = sd->Data;
  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  SVar5 = SzReadNumber32(sd,&local_34);
  if (SVar5 != 0) {
    return SVar5;
  }
  uVar19 = (ulong)local_34;
  if (local_34 - 5 < 0xfffffffc) {
    return 4;
  }
  local_60 = uVar19;
  SVar5 = 0;
  if (local_34 == 0) {
    uVar7 = 0;
  }
  else {
    local_40 = f->Coders;
    uVar17 = 0;
    uVar7 = 0;
    do {
      if (sd->Size == 0) {
LAB_005cc6d1:
        bVar20 = false;
        SVar5 = 0x10;
        goto LAB_005cc6d8;
      }
      uVar10 = sd->Size - 1;
      sd->Size = uVar10;
      pbVar3 = sd->Data;
      sd->Data = pbVar3 + 1;
      bVar1 = *pbVar3;
      if (bVar1 < 0x40) {
        uVar6 = bVar1 & 0xf;
        uVar9 = (ulong)uVar6;
        if (8 < uVar6) goto LAB_005cc6c3;
        if (uVar10 < uVar9) goto LAB_005cc6d1;
        if ((bVar1 & 0xf) == 0) {
          uVar10 = 0;
        }
        else {
          sVar16 = sd->Size;
          uVar10 = 0;
          pbVar3 = sd->Data;
          do {
            sVar16 = sVar16 - 1;
            uVar10 = uVar10 << 8 | (ulong)*pbVar3;
            sd->Data = pbVar3 + 1;
            sd->Size = sVar16;
            uVar6 = (int)uVar9 - 1;
            uVar9 = (ulong)uVar6;
            pbVar3 = pbVar3 + 1;
          } while (uVar6 != 0);
        }
        if (uVar10 >> 0x20 != 0) goto LAB_005cc6c3;
        local_50 = pBVar13;
        pCVar12 = local_40 + uVar17;
        pCVar12->MethodID = (UInt32)uVar10;
        pCVar12->NumStreams = '\x01';
        pCVar12->PropsSize = '\0';
        pCVar12->PropsOffset = 0;
        if ((bVar1 & 0x10) != 0) {
          local_58 = (CSzFolder *)CONCAT44(local_58._4_4_,uVar7);
          SVar8 = SzReadNumber32(sd,local_68);
          if (SVar8 == 0) {
            if (7 < local_68[0]) {
              SVar8 = 4;
              goto LAB_005cc78f;
            }
            pCVar12->NumStreams = (Byte)local_68[0];
            SVar8 = SzReadNumber32(sd,local_68);
            if (SVar8 != 0) goto LAB_005cc78f;
            bVar20 = local_68[0] == 1;
            if (!bVar20) {
              SVar5 = 4;
            }
          }
          else {
LAB_005cc78f:
            SVar5 = SVar8;
            bVar20 = false;
          }
          uVar19 = local_60;
          uVar7 = (uint)local_58;
          if (!bVar20) {
            bVar20 = false;
            pBVar13 = local_50;
            goto LAB_005cc6d8;
          }
        }
        uVar7 = uVar7 + pCVar12->NumStreams;
        pBVar13 = local_50;
        if (uVar7 < 8) {
          bVar20 = true;
          if (0x1f < bVar1) {
            local_58 = (CSzFolder *)CONCAT44(local_58._4_4_,uVar7);
            local_68[0] = 0;
            SVar8 = SzReadNumber32(sd,local_68);
            if (SVar8 != 0) {
              SVar5 = SVar8;
            }
            pBVar13 = local_50;
            uVar19 = local_60;
            uVar7 = (uint)local_58;
            if (SVar8 == 0) {
              uVar9 = (ulong)local_68[0];
              uVar10 = sd->Size;
              if (uVar10 < uVar9) {
                SVar5 = 0x10;
              }
              else {
                if (local_68[0] < 0x80) {
                  pBVar4 = sd->Data;
                  pCVar12->PropsOffset = (long)pBVar4 - (long)local_50;
                  pCVar12->PropsSize = (Byte)local_68[0];
                  sd->Data = pBVar4 + uVar9;
                  sd->Size = uVar10 - uVar9;
                  bVar20 = true;
                  goto LAB_005cc6d8;
                }
                SVar5 = 4;
              }
              bVar20 = false;
            }
            else {
              bVar20 = false;
            }
          }
        }
        else {
          bVar20 = false;
          SVar5 = 4;
        }
      }
      else {
LAB_005cc6c3:
        bVar20 = false;
        SVar5 = 4;
      }
LAB_005cc6d8:
      if (!bVar20) {
        return SVar5;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar19);
  }
  UVar15 = (UInt32)uVar19;
  UVar18 = UVar15 - 1;
  if (uVar7 < UVar18) {
LAB_005cc894:
    bVar20 = false;
    SVar5 = 0x10;
  }
  else {
    if (UVar18 < 4) {
      pBVar13 = (Byte *)(ulong)uVar7;
      f->NumBonds = UVar18;
      uVar7 = uVar7 - UVar18;
      if (uVar7 < 5) {
        local_40 = (CSzCoderInfo *)(ulong)uVar7;
        f->NumPackStreams = uVar7;
        if (pBVar13 != (Byte *)0x0) {
          memset(local_68,0,(size_t)pBVar13);
        }
        UVar15 = (UInt32)local_60;
        if (UVar18 != 0) {
          local_58 = f;
          local_50 = pBVar13;
          if (UVar15 != 0) {
            memset(&local_44,0,local_60);
          }
          uVar19 = (ulong)(UVar18 + (UVar18 == 0));
          value = &local_58->Bonds[0].OutIndex;
          local_38 = UVar18;
          do {
            SVar8 = SzReadNumber32(sd,value + -1);
            if (SVar8 == 0) {
              uVar7 = ((CSzBond *)(value + -1))->InIndex;
              if ((uVar7 < (uint)local_50) && (*(char *)((long)local_68 + (ulong)uVar7) == '\0')) {
                *(undefined1 *)((long)local_68 + (ulong)uVar7) = 1;
                SVar8 = SzReadNumber32(sd,value);
                if (SVar8 != 0) goto LAB_005cc945;
                uVar7 = *value;
                if ((uint)local_60 <= uVar7) goto LAB_005cc961;
                cVar2 = *(char *)((long)&local_44 + (ulong)uVar7);
                bVar20 = cVar2 == '\0';
                *(char *)((long)&local_44 + (ulong)uVar7) = cVar2 + (cVar2 == '\0');
                if (!bVar20) {
                  SVar5 = 0x10;
                }
              }
              else {
LAB_005cc961:
                bVar20 = false;
                SVar5 = 0x10;
              }
            }
            else {
LAB_005cc945:
              SVar5 = SVar8;
              bVar20 = false;
            }
            UVar15 = (UInt32)local_60;
            if (!bVar20) {
              bVar20 = false;
              goto LAB_005cca21;
            }
            value = value + 2;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
          uVar19 = 0;
          if (UVar15 != 0) {
            do {
              if (*(char *)((long)&local_44 + uVar19) == '\0') {
                local_58->UnpackStream = (UInt32)uVar19;
                goto LAB_005cca13;
              }
              uVar19 = uVar19 + 1;
            } while (UVar15 != (UInt32)uVar19);
            uVar19 = local_60 & 0xffffffff;
          }
LAB_005cca13:
          bVar20 = (UInt32)uVar19 != UVar15;
          if (!bVar20) {
            SVar5 = 0x10;
          }
LAB_005cca21:
          pBVar13 = local_50;
          f = local_58;
          UVar18 = local_38;
          if (!bVar20) {
            bVar20 = false;
            goto LAB_005cc8b7;
          }
        }
        UVar11 = (UInt32)pBVar13;
        if ((int)local_40 != 1) {
          bVar20 = true;
          if (UVar11 != UVar18) {
            uVar7 = (int)local_40 + (uint)((int)local_40 == 0);
            lVar14 = 0;
            local_50 = pBVar13;
            do {
              SVar8 = SzReadNumber32(sd,&local_44);
              uVar6 = local_44;
              uVar19 = local_60;
              if (SVar8 == 0) {
                if ((local_44 < (uint)local_50) &&
                   (*(char *)((long)local_68 + (ulong)local_44) == '\0')) {
                  *(undefined1 *)((long)local_68 + (ulong)local_44) = 1;
                  f->PackStreams[lVar14] = uVar6;
                  bVar20 = true;
                }
                else {
                  bVar20 = false;
                  SVar5 = 0x10;
                }
              }
              else {
                bVar20 = false;
                SVar5 = SVar8;
              }
              UVar15 = (UInt32)uVar19;
            } while ((bVar20) && (bVar21 = (ulong)uVar7 - 1 != lVar14, lVar14 = lVar14 + 1, bVar21))
            ;
          }
          goto LAB_005cc8b7;
        }
        uVar19 = 0;
        if (pBVar13 != (Byte *)0x0) {
          do {
            if (*(char *)((long)local_68 + uVar19) == '\0') goto LAB_005cca46;
            uVar19 = uVar19 + 1;
          } while (UVar11 != (UInt32)uVar19);
          uVar19 = (ulong)pBVar13 & 0xffffffff;
        }
LAB_005cca46:
        if ((UInt32)uVar19 != UVar11) {
          f->PackStreams[0] = (UInt32)uVar19;
          bVar20 = true;
          goto LAB_005cc8b7;
        }
        goto LAB_005cc894;
      }
    }
    bVar20 = false;
    SVar5 = 4;
  }
LAB_005cc8b7:
  if (bVar20) {
    f->NumCoders = UVar15;
    SVar5 = 0;
  }
  return SVar5;
}

Assistant:

SRes SzGetNextFolderItem(CSzFolder *f, CSzData *sd)
{
  UInt32 numCoders, i;
  UInt32 numInStreams = 0;
  const Byte *dataStart = sd->Data;

  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  
  RINOK(SzReadNumber32(sd, &numCoders));
  if (numCoders == 0 || numCoders > SZ_NUM_CODERS_IN_FOLDER_MAX)
    return SZ_ERROR_UNSUPPORTED;
  
  for (i = 0; i < numCoders; i++)
  {
    Byte mainByte;
    CSzCoderInfo *coder = f->Coders + i;
    unsigned idSize, j;
    UInt64 id;
    
    SZ_READ_BYTE(mainByte);
    if ((mainByte & 0xC0) != 0)
      return SZ_ERROR_UNSUPPORTED;
    
    idSize = (unsigned)(mainByte & 0xF);
    if (idSize > sizeof(id))
      return SZ_ERROR_UNSUPPORTED;
    if (idSize > sd->Size)
      return SZ_ERROR_ARCHIVE;
    id = 0;
    for (j = 0; j < idSize; j++)
    {
      id = ((id << 8) | *sd->Data);
      sd->Data++;
      sd->Size--;
    }
    if (id > (UInt32)0xFFFFFFFF)
      return SZ_ERROR_UNSUPPORTED;
    coder->MethodID = (UInt32)id;
    
    coder->NumStreams = 1;
    coder->PropsOffset = 0;
    coder->PropsSize = 0;
    
    if ((mainByte & 0x10) != 0)
    {
      UInt32 numStreams;
      
      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams > k_NumCodersStreams_in_Folder_MAX)
        return SZ_ERROR_UNSUPPORTED;
      coder->NumStreams = (Byte)numStreams;

      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams != 1)
        return SZ_ERROR_UNSUPPORTED;
    }

    numInStreams += coder->NumStreams;

    if (numInStreams > k_NumCodersStreams_in_Folder_MAX)
      return SZ_ERROR_UNSUPPORTED;

    if ((mainByte & 0x20) != 0)
    {
      UInt32 propsSize = 0;
      RINOK(SzReadNumber32(sd, &propsSize));
      if (propsSize > sd->Size)
        return SZ_ERROR_ARCHIVE;
      if (propsSize >= 0x80)
        return SZ_ERROR_UNSUPPORTED;
      coder->PropsOffset = sd->Data - dataStart;
      coder->PropsSize = (Byte)propsSize;
      sd->Data += (size_t)propsSize;
      sd->Size -= (size_t)propsSize;
    }
  }

  /*
  if (numInStreams == 1 && numCoders == 1)
  {
    f->NumPackStreams = 1;
    f->PackStreams[0] = 0;
  }
  else
  */
  {
    Byte streamUsed[k_NumCodersStreams_in_Folder_MAX];
    UInt32 numBonds, numPackStreams;
    
    numBonds = numCoders - 1;
    if (numInStreams < numBonds)
      return SZ_ERROR_ARCHIVE;
    if (numBonds > SZ_NUM_BONDS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumBonds = numBonds;
    
    numPackStreams = numInStreams - numBonds;
    if (numPackStreams > SZ_NUM_PACK_STREAMS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumPackStreams = numPackStreams;
  
    for (i = 0; i < numInStreams; i++)
      streamUsed[i] = False;
    
    if (numBonds != 0)
    {
      Byte coderUsed[SZ_NUM_CODERS_IN_FOLDER_MAX];

      for (i = 0; i < numCoders; i++)
        coderUsed[i] = False;
      
      for (i = 0; i < numBonds; i++)
      {
        CSzBond *bp = f->Bonds + i;
        
        RINOK(SzReadNumber32(sd, &bp->InIndex));
        if (bp->InIndex >= numInStreams || streamUsed[bp->InIndex])
          return SZ_ERROR_ARCHIVE;
        streamUsed[bp->InIndex] = True;
        
        RINOK(SzReadNumber32(sd, &bp->OutIndex));
        if (bp->OutIndex >= numCoders || coderUsed[bp->OutIndex])
          return SZ_ERROR_ARCHIVE;
        coderUsed[bp->OutIndex] = True;
      }
      
      for (i = 0; i < numCoders; i++)
        if (!coderUsed[i])
        {
          f->UnpackStream = i;
          break;
        }
      
      if (i == numCoders)
        return SZ_ERROR_ARCHIVE;
    }
    
    if (numPackStreams == 1)
    {
      for (i = 0; i < numInStreams; i++)
        if (!streamUsed[i])
          break;
      if (i == numInStreams)
        return SZ_ERROR_ARCHIVE;
      f->PackStreams[0] = i;
    }
    else
      for (i = 0; i < numPackStreams; i++)
      {
        UInt32 index;
        RINOK(SzReadNumber32(sd, &index));
        if (index >= numInStreams || streamUsed[index])
          return SZ_ERROR_ARCHIVE;
        streamUsed[index] = True;
        f->PackStreams[i] = index;
      }
  }

  f->NumCoders = numCoders;

  return SZ_OK;
}